

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall Clasp::Solver::estimateBCP(Solver *this,Literal *p,int rd)

{
  Assignment *out;
  uint uVar1;
  uint uVar2;
  Literal p_00;
  pointer puVar3;
  SharedContext *pSVar4;
  pointer pLVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = p->rep_;
  puVar3 = (this->assign_).assign_.ebo_.buf;
  uVar9 = *(uint *)((long)puVar3 + (ulong)(uVar1 & 0xfffffffc));
  if ((uVar9 & 3) != 0) {
    return 0;
  }
  out = &this->assign_;
  uVar2 = (this->assign_).trail.ebo_.size;
  puVar3[uVar1 >> 2] = (uVar9 - ((uVar1 & 2) == 0)) + 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(&out->trail,p);
  pSVar4 = this->shared_;
  uVar1 = (pSVar4->btig_).graph_.ebo_.size;
  uVar9 = uVar2;
  do {
    p_00.rep_ = (out->trail).ebo_.buf[uVar9].rep_;
    if (p_00.rep_ >> 1 < uVar1) {
      bVar6 = ShortImplicationsGraph::propagateBin(&pSVar4->btig_,out,p_00,0);
      uVar8 = (this->assign_).trail.ebo_.size;
      if (!bVar6) {
LAB_0016a7d3:
        uVar7 = uVar8 - uVar2;
        if (uVar7 == 0) {
          return 0;
        }
        pLVar5 = (this->assign_).trail.ebo_.buf;
        puVar3 = (this->assign_).assign_.ebo_.buf;
        do {
          *(undefined4 *)((long)puVar3 + (ulong)(pLVar5[uVar8 - 1].rep_ & 0xfffffffc)) = 0;
          uVar8 = (this->assign_).trail.ebo_.size - 1;
          (this->assign_).trail.ebo_.size = uVar8;
        } while (uVar8 != uVar2);
        return uVar7;
      }
    }
    else {
      uVar8 = (this->assign_).trail.ebo_.size;
    }
    uVar9 = uVar9 + 1;
    bVar6 = rd == 0;
    rd = rd + -1;
    if ((uVar8 <= uVar9) || (bVar6)) goto LAB_0016a7d3;
  } while( true );
}

Assistant:

uint32 Solver::estimateBCP(const Literal& p, int rd) const {
	if (value(p.var()) != value_free) return 0;
	LitVec::size_type first = assign_.assigned();
	LitVec::size_type i     = first;
	Solver& self            = const_cast<Solver&>(*this);
	self.assign_.setValue(p.var(), trueValue(p));
	self.assign_.trail.push_back(p);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	do {
		Literal x = assign_.trail[i++];
		if (x.id() < maxIdx && !btig.propagateBin(self.assign_, x, 0)) {
			break;
		}
	} while (i < assign_.assigned() && rd-- != 0);
	i = assign_.assigned()-first;
	while (self.assign_.assigned() != first) {
		self.assign_.undoLast();
	}
	return (uint32)i;
}